

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O3

bool __thiscall S2Polygon::Intersects(S2Polygon *this,S2Polygon *b)

{
  pointer puVar1;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var2;
  bool bVar3;
  pointer *__ptr;
  Options local_48;
  
  bVar3 = S2LatLngRect::Intersects(&this->bound_,&b->bound_);
  if (bVar3) {
    puVar1 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((((long)(this->loops_).
                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 & 0x7fffffff8U) != 8) ||
         (_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
               (puVar1->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
         *(int *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc) != 1)) ||
        ((*(byte *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a) & 1) == 0)) ||
       (((puVar1 = (b->loops_).
                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         ((long)(b->loops_).
                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 & 0x7fffffff8U) != 8 ||
         (_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
               (puVar1->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
         *(int *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc) != 1)) ||
        (bVar3 = true,
        (*(byte *)((long)_Var2._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                         super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a) & 1) == 0)))) {
      S2BooleanOperation::Options::Options(&local_48);
      bVar3 = S2BooleanOperation::IsEmpty
                        (INTERSECTION,&(b->index_).super_S2ShapeIndex,
                         &(this->index_).super_S2ShapeIndex,&local_48);
      if ((_Head_base<0UL,_S2Builder::SnapFunction_*,_false>)
          local_48.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
          (_Head_base<0UL,_S2Builder::SnapFunction_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_48.snap_function_._M_t.
            super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
            ._M_t.
            super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
            .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
      }
      bVar3 = !bVar3;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool S2Polygon::Intersects(const S2Polygon* b) const {
  // It's worth checking bounding rectangles, since they are precomputed.
  if (!bound_.Intersects(b->bound_)) return false;

  // The following case is not handled by S2BooleanOperation because it only
  // determines whether the boundary of the result is empty (which does not
  // distinguish between the full and empty polygons).
  if (is_full() && b->is_full()) return true;

  return S2BooleanOperation::Intersects(index_, b->index_);
}